

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_2::PassthroughTestInstance::Params::Params(Params *this)

{
  PipelineDescription *local_28;
  Params *this_local;
  
  this->useTessLevels = false;
  memset(&this->tessLevels,0,0x18);
  this->primitiveType = TESSPRIMITIVETYPE_TRIANGLES;
  this->inputPatchVertices = 0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->vertices);
  local_28 = this->pipelineCases;
  do {
    PipelineDescription::PipelineDescription(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != (PipelineDescription *)&this->message);
  std::__cxx11::string::string((string *)&this->message);
  return;
}

Assistant:

Params (void) : useTessLevels(), tessLevels(), primitiveType(), inputPatchVertices() {}